

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantag.cpp
# Opt level: O3

string * __thiscall
YAML::ScanTagHandle_abi_cxx11_
          (string *__return_storage_ptr__,YAML *this,Stream *INPUT,bool *canBeHandle)

{
  byte bVar1;
  bool bVar2;
  char cVar3;
  int n;
  RegEx *pRVar4;
  Exception *this_00;
  Mark local_60;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  *(undefined1 *)&INPUT->m_input = 1;
  local_60.pos = 0;
  local_60.line = 0;
  local_60.column = 0;
  do {
    bVar2 = Stream::operator_cast_to_bool((Stream *)this);
    if (!bVar2) {
      return __return_storage_ptr__;
    }
    cVar3 = Stream::peek((Stream *)this);
    bVar1 = *(byte *)&INPUT->m_input;
    if (cVar3 == '!') {
      if (bVar1 != 0) {
        return __return_storage_ptr__;
      }
      this_00 = (Exception *)__cxa_allocate_exception(0x40);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"illegal character found while scanning tag handle","");
      Exception::Exception(this_00,&local_60,&local_50);
      *(undefined ***)this_00 = &PTR__BadFile_008779d0;
      __cxa_throw(this_00,&ParserException::typeinfo,BadFile::~BadFile);
    }
    n = 0;
    if (bVar1 == 0) {
LAB_00715995:
      if ((bVar1 & 1) == 0) goto LAB_007159b1;
    }
    else {
      pRVar4 = Exp::Word();
      local_50._M_dataplus._M_p = (pointer)0x0;
      local_50._M_string_length = (size_type)this;
      n = RegEx::Match<YAML::StreamCharSource>(pRVar4,(StreamCharSource *)&local_50);
      if (0 < n) {
        bVar1 = *(byte *)&INPUT->m_input;
        goto LAB_00715995;
      }
      *(undefined1 *)&INPUT->m_input = 0;
      local_60._0_8_ = *(undefined8 *)(this + 8);
      local_60.column = *(int *)(this + 0x10);
LAB_007159b1:
      pRVar4 = Exp::Tag();
      local_50._M_dataplus._M_p = (pointer)0x0;
      local_50._M_string_length = (size_type)this;
      n = RegEx::Match<YAML::StreamCharSource>(pRVar4,(StreamCharSource *)&local_50);
    }
    if (n < 1) {
      return __return_storage_ptr__;
    }
    Stream::get_abi_cxx11_(&local_50,(Stream *)this,n);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  } while( true );
}

Assistant:

const std::string ScanTagHandle(Stream& INPUT, bool& canBeHandle) {
  std::string tag;
  canBeHandle = true;
  Mark firstNonWordChar;

  while (INPUT) {
    if (INPUT.peek() == Keys::Tag) {
      if (!canBeHandle)
        throw ParserException(firstNonWordChar, ErrorMsg::CHAR_IN_TAG_HANDLE);
      break;
    }

    int n = 0;
    if (canBeHandle) {
      n = Exp::Word().Match(INPUT);
      if (n <= 0) {
        canBeHandle = false;
        firstNonWordChar = INPUT.mark();
      }
    }

    if (!canBeHandle)
      n = Exp::Tag().Match(INPUT);

    if (n <= 0)
      break;

    tag += INPUT.get(n);
  }

  return tag;
}